

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O1

Kind __thiscall
avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>::advance
          (SimpleParser<avro::parsing::ResolvingDecoderHandler> *this,Kind k)

{
  stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  *this_00;
  Symbol *this_01;
  Kind KVar1;
  element_type *peVar2;
  bool bVar3;
  tuple<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *ptVar4;
  weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> *pwVar5;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> *psVar6;
  tuple<unsigned_long,_bool,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *ptVar7;
  pair<avro::parsing::Symbol::Kind,_avro::parsing::Symbol::Kind> *ppVar8;
  size_t n;
  ostream *poVar9;
  undefined8 *puVar10;
  Kind unaff_EBP;
  _Elt_pointer pSVar11;
  value_type *pvVar12;
  pointer pSVar13;
  ProductionPtr pp;
  weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  local_1c8 [2];
  undefined1 local_1a8 [8];
  shared_count local_1a0 [46];
  
  this_00 = &this->parsingStack;
  do {
    pSVar11 = (this->parsingStack).c.
              super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pSVar11 ==
        (this->parsingStack).c.
        super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pSVar11 = (this->parsingStack).c.
                super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    KVar1 = pSVar11[-1].kind_;
    if (KVar1 == k) {
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
      bVar3 = true;
      unaff_EBP = k;
      goto LAB_001a1463;
    }
    if (KVar1 - sNull < 0xf) {
      throwMismatch(k,KVar1);
      goto LAB_001a13f1;
    }
    this_01 = pSVar11 + -1;
    switch(KVar1) {
    case sRoot:
      ptVar4 = boost::
               any_cast<boost::tuples::tuple<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                         (&pSVar11[-1].extra_);
      peVar2 = (ptVar4->super_type).head.px;
      pSVar13 = (peVar2->
                super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if (pSVar13 !=
          (peVar2->super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        do {
          std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                    (&this_00->c,pSVar13);
          pSVar13 = pSVar13 + 1;
        } while (pSVar13 !=
                 (((ptVar4->super_type).head.px)->
                 super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>).
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      break;
    case sRepeater:
      ptVar7 = boost::
               any_cast<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                         (&pSVar11[-1].extra_);
      (ptVar7->super_type).head = (ptVar7->super_type).head - 1;
      peVar2 = (ptVar7->super_type).tail.tail.head.px;
      pSVar13 = (peVar2->
                super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if (pSVar13 !=
          (peVar2->super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        do {
          std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                    (&this_00->c,pSVar13);
          pSVar13 = pSVar13 + 1;
        } while (pSVar13 !=
                 (((ptVar7->super_type).tail.tail.head.px)->
                 super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>).
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      break;
    case sIndirect:
      psVar6 = boost::
               any_cast<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>const&>
                         (&pSVar11[-1].extra_);
      local_1a8 = (undefined1  [8])psVar6->px;
      local_1a0[0].pi_ = (psVar6->pn).pi_;
      if (local_1a0[0].pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_1a0[0].pi_)->use_count_ = (local_1a0[0].pi_)->use_count_ + 1;
        UNLOCK();
      }
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
      for (pvVar12 = *(value_type **)local_1a8; pvVar12 != *(pointer *)((long)local_1a8 + 8);
          pvVar12 = pvVar12 + 1) {
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                  (&this_00->c,pvVar12);
      }
      goto LAB_001a1391;
    case sSymbolic:
      pwVar5 = boost::
               any_cast<boost::weak_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>const&>
                         (&pSVar11[-1].extra_);
      local_1c8[0].px = pwVar5->px;
      local_1c8[0].pn.pi_ = (pwVar5->pn).pi_;
      if (local_1c8[0].pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_1c8[0].pn.pi_)->weak_count_ = (local_1c8[0].pn.pi_)->weak_count_ + 1;
        UNLOCK();
      }
      boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>::
      shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                ((shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                  *)local_1a8,local_1c8);
      boost::detail::weak_count::~weak_count(&local_1c8[0].pn);
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
      for (pvVar12 = *(value_type **)local_1a8; pvVar12 != *(pointer *)((long)local_1a8 + 8);
          pvVar12 = pvVar12 + 1) {
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                  (&this_00->c,pvVar12);
      }
LAB_001a1391:
      boost::detail::shared_count::~shared_count(local_1a0);
LAB_001a13f1:
      bVar3 = false;
      goto LAB_001a1463;
    case sSkipStart:
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
      skip(this,this->decoder_);
      goto LAB_001a13f1;
    case sResolve:
      ppVar8 = boost::any_cast<std::pair<avro::parsing::Symbol::Kind,avro::parsing::Symbol::Kind>>
                         (&pSVar11[-1].extra_);
      if (ppVar8->second != k) {
        throwMismatch(ppVar8->second,k);
      }
      unaff_EBP = ppVar8->first;
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
      bVar3 = true;
      goto LAB_001a1463;
    default:
      if (KVar1 == sError) {
        puVar10 = (undefined8 *)__cxa_allocate_exception(0x18);
        Symbol::extra<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   this_01);
        std::runtime_error::runtime_error((runtime_error *)(puVar10 + 1),(string *)local_1a8);
        *puVar10 = 0x1cd6f0;
        puVar10[1] = 0x1cd720;
        __cxa_throw(puVar10,&Exception::typeinfo,Exception::~Exception);
      }
    case sAlternative:
    case sPlaceholder:
    case sEnumAdjust:
    case sUnionAdjust:
      if (7 < KVar1 - sRecordStart) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Encountered ",0xc);
        poVar9 = std::operator<<((ostream *)local_1a8,
                                 *(char **)(Symbol::stringValues + (ulong)this_01->kind_ * 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," while looking for ",0x13);
        std::operator<<(poVar9,*(char **)(Symbol::stringValues + (ulong)k * 8));
        puVar10 = (undefined8 *)__cxa_allocate_exception(0x18);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error((runtime_error *)(puVar10 + 1),(string *)local_1c8);
        *puVar10 = 0x1cd6f0;
        puVar10[1] = 0x1cd720;
        __cxa_throw(puVar10,&Exception::typeinfo,Exception::~Exception);
      }
      n = ResolvingDecoderHandler::handle(this->handler_,this_01);
      KVar1 = this_01->kind_;
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
      if (KVar1 == sWriterUnion) {
        selectBranch(this,n);
      }
    }
    bVar3 = false;
LAB_001a1463:
    if (bVar3) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

Symbol::Kind advance(Symbol::Kind k) {
        for (; ;) {
            Symbol& s = parsingStack.top();
            if (s.kind() == k) {
                parsingStack.pop();
                return k;
            } else if (s.isTerminal()) {
                throwMismatch(k, s.kind());
            } else {
                switch (s.kind()) {
                case Symbol::sRoot:
                    append(boost::tuples::get<0>(*s.extrap<RootInfo>()));
                    continue;
                case Symbol::sIndirect:
                    {
                        ProductionPtr pp =
                            s.extra<ProductionPtr>();
                        parsingStack.pop();
                        append(pp);
                    }
                    continue;
                case Symbol::sSymbolic:
                    {
                        ProductionPtr pp(
                            s.extra<boost::weak_ptr<Production> >());
                        parsingStack.pop();
                        append(pp);
                    }
                    continue;
                case Symbol::sRepeater:
                    {
                        RepeaterInfo *p = s.extrap<RepeaterInfo>();
                        --boost::tuples::get<0>(*p);
                        append(boost::tuples::get<2>(*p));
                    }
                    continue;
                case Symbol::sError:
                    throw Exception(s.extra<std::string>());
                case Symbol::sResolve:
                    {
                        const std::pair<Symbol::Kind, Symbol::Kind>* p =
                            s.extrap<std::pair<Symbol::Kind, Symbol::Kind> >();
                        assertMatch(p->second, k);
                        Symbol::Kind result = p->first;
                        parsingStack.pop();
                        return result;
                    }
                case Symbol::sSkipStart:
                    parsingStack.pop();
                    skip(*decoder_);
                    break;
                default:
                    if (s.isImplicitAction()) {
                        size_t n = handler_.handle(s);
                        if (s.kind() == Symbol::sWriterUnion) {
                            parsingStack.pop();
                            selectBranch(n); 
                        } else {
                            parsingStack.pop();
                        }
                    } else {
                        std::ostringstream oss;
                        oss << "Encountered " << Symbol::toString(s.kind())
                            << " while looking for " << Symbol::toString(k);
                        throw Exception(oss.str());
                    }
                }
            }
        }
    }